

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::CoapSecure::GetLocalAddr
          (Error *__return_storage_ptr__,CoapSecure *this,Address *aAddr)

{
  bool bVar1;
  element_type *peVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  Address local_150;
  anon_class_1_0_00000001 local_132;
  v10 local_131;
  v10 *local_130;
  size_t local_128;
  string local_120;
  Error local_100;
  undefined1 local_c1;
  Address *local_c0;
  Address *aAddr_local;
  CoapSecure *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_c1 = 0;
  local_c0 = aAddr;
  aAddr_local = (Address *)this;
  this_local = (CoapSecure *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = Socket::IsConnected(&peVar2->super_Socket);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (*(peVar2->super_Socket)._vptr_Socket[3])(&local_150);
    Address::operator=(local_c0,&local_150);
    Address::~Address(&local_150);
  }
  else {
    GetLocalAddr::anon_class_1_0_00000001::operator()(&local_132);
    local_58 = &local_130;
    local_60 = &local_131;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_128 = bVar3.size_;
    local_130 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_120;
    local_78 = local_130;
    sStack_70 = local_128;
    local_50 = &local_78;
    local_88 = local_130;
    local_80 = local_128;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_120,local_88,fmt,args);
    Error::Error(&local_100,kInvalidState,&local_120);
    Error::operator=(__return_storage_ptr__,&local_100);
    Error::~Error(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetLocalAddr(Address &aAddr) const
    {
        Error error;

        VerifyOrExit(mSocket->IsConnected(), error = ERROR_INVALID_STATE("socket is not connected"));
        aAddr = mSocket->GetLocalAddr();

    exit:
        return error;
    }